

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMInterpreter.cpp
# Opt level: O0

ExecutionResult * __thiscall
cmm::CMMInterpreter::executeStatement
          (ExecutionResult *__return_storage_ptr__,CMMInterpreter *this,VariableEnv *Env,
          StatementAST *Stmt)

{
  StatementAST *pSVar1;
  StatementKind SVar2;
  DeclarationListAST *DeclList;
  ExprStatementAST *Stmt_00;
  BlockAST *Block;
  IfStatementAST *Stmt_01;
  ReturnStatementAST *Stmt_02;
  WhileStatementAST *WhileStmt;
  ForStatementAST *ForStmt;
  ContinueStatementAST *ContStmt;
  BreakStatementAST *pBVar3;
  allocator local_99;
  string local_98;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  StatementAST *local_28;
  StatementAST *Stmt_local;
  VariableEnv *Env_local;
  CMMInterpreter *this_local;
  
  local_28 = Stmt;
  Stmt_local = (StatementAST *)Env;
  Env_local = (VariableEnv *)this;
  this_local = (CMMInterpreter *)__return_storage_ptr__;
  if (Stmt == (StatementAST *)0x0) {
    ExecutionResult::ExecutionResult(__return_storage_ptr__);
  }
  else {
    SVar2 = StatementAST::getKind(Stmt);
    pSVar1 = Stmt_local;
    switch(SVar2) {
    case ExprStatement:
      Stmt_00 = StatementAST::as_cptr<cmm::ExprStatementAST>(local_28);
      executeExprStatement(__return_storage_ptr__,this,(VariableEnv *)pSVar1,Stmt_00);
      break;
    case BlockStatement:
      Block = StatementAST::as_cptr<cmm::BlockAST>(local_28);
      executeBlock(__return_storage_ptr__,this,(VariableEnv *)pSVar1,Block);
      break;
    case IfStatement:
      Stmt_01 = StatementAST::as_cptr<cmm::IfStatementAST>(local_28);
      executeIfStatement(__return_storage_ptr__,this,(VariableEnv *)pSVar1,Stmt_01);
      break;
    case WhileStatement:
      WhileStmt = StatementAST::as_cptr<cmm::WhileStatementAST>(local_28);
      executeWhileStatement(__return_storage_ptr__,this,(VariableEnv *)pSVar1,WhileStmt);
      break;
    case ForStatement:
      ForStmt = StatementAST::as_cptr<cmm::ForStatementAST>(local_28);
      executeForStatement(__return_storage_ptr__,this,(VariableEnv *)pSVar1,ForStmt);
      break;
    case ReturnStatement:
      Stmt_02 = StatementAST::as_cptr<cmm::ReturnStatementAST>(local_28);
      executeReturnStatement(__return_storage_ptr__,this,(VariableEnv *)pSVar1,Stmt_02);
      break;
    case ContinueStatement:
      ContStmt = StatementAST::as_cptr<cmm::ContinueStatementAST>(local_28);
      executeContinueStatement(__return_storage_ptr__,this,(VariableEnv *)pSVar1,ContStmt);
      break;
    case BreakStatement:
      pBVar3 = StatementAST::as_cptr<cmm::BreakStatementAST>(local_28);
      executeBreakStatement(__return_storage_ptr__,this,(VariableEnv *)pSVar1,pBVar3);
      break;
    default:
      SVar2 = StatementAST::getKind(local_28);
      std::__cxx11::to_string(&local_68,SVar2);
      std::operator+(&local_48,&local_68,": unknown statement kind");
      RuntimeError(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
    case DeclarationStatement:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_98,"single declaration should not be used by user",&local_99);
      RuntimeError(this,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    case DeclarationListStatement:
      pSVar1 = Stmt_local;
      DeclList = StatementAST::as_cptr<cmm::DeclarationListAST>(local_28);
      executeDeclarationList(__return_storage_ptr__,this,(VariableEnv *)pSVar1,DeclList);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CMMInterpreter::ExecutionResult
CMMInterpreter::executeStatement(VariableEnv *Env, const StatementAST *Stmt) {
  if (!Stmt)
    return ExecutionResult();

  switch (Stmt->getKind()) {
  default:
    RuntimeError(std::to_string(Stmt->getKind()) + ": unknown statement kind");
  case StatementAST::DeclarationStatement:
    RuntimeError("single declaration should not be used by user");
  case StatementAST::DeclarationListStatement:
    return executeDeclarationList(Env, Stmt->as_cptr<DeclarationListAST>());
  case StatementAST::ExprStatement:
    return executeExprStatement(Env, Stmt->as_cptr<ExprStatementAST>());
  case StatementAST::BlockStatement:
    return executeBlock(Env, Stmt->as_cptr<BlockAST>());
  case StatementAST::IfStatement:
    return executeIfStatement(Env, Stmt->as_cptr<IfStatementAST>());
  case StatementAST::ReturnStatement:
    return executeReturnStatement(Env, Stmt->as_cptr<ReturnStatementAST>());
  case StatementAST::WhileStatement:
    return executeWhileStatement(Env, Stmt->as_cptr<WhileStatementAST>());
  case StatementAST::ForStatement:
    return executeForStatement(Env, Stmt->as_cptr<ForStatementAST>());
  case StatementAST::ContinueStatement:
    return executeContinueStatement(Env, Stmt->as_cptr<ContinueStatementAST>());
  case StatementAST::BreakStatement:
    return executeBreakStatement(Env, Stmt->as_cptr<BreakStatementAST>());
  }
}